

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMeshSurface.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChMeshSurface::AddFacesFromNodeSet
          (ChMeshSurface *this,
          vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
          *node_set)

{
  __node_base_ptr p_Var1;
  _Hash_node_base *p_Var2;
  int iVar3;
  byte bVar4;
  int iVar5;
  pointer psVar6;
  pointer psVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  __node_base_ptr p_Var9;
  element_type *peVar10;
  long lVar11;
  __node_base_ptr p_Var12;
  int in;
  uint uVar13;
  ulong uVar14;
  byte bVar15;
  bool bVar16;
  shared_ptr<chrono::fea::ChElementTetrahedron> tet;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  node_set_map;
  new_allocator<chrono::fea::ChTetrahedronFace> local_e1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  shared_ptr<chrono::fea::ChElementHexahedron> local_d8;
  _Hash_node_base *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  element_type *local_b8;
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  ChHexahedronFace *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  ChTetrahedronFace *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  ulong local_80;
  _func_int **local_78;
  _func_int **local_70;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  psVar6 = (node_set->
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((node_set->
      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != psVar6) {
    lVar11 = 0;
    uVar14 = 0;
    do {
      local_c8 = *(_Hash_node_base **)
                  ((long)&(psVar6->
                          super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr + lVar11);
      local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)&local_68;
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_68,&local_c8,&local_d8);
      uVar14 = uVar14 + 1;
      psVar6 = (node_set->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x10;
    } while (uVar14 < (ulong)((long)(node_set->
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)psVar6 >> 4)
            );
  }
  psVar7 = (this->mmesh->velements).
           super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->mmesh->velements).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7) >> 4) != 0) {
    local_78 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b52838;
    local_70 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b527e8;
    uVar14 = 0;
    do {
      peVar10 = psVar7[uVar14].
                super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_e0 = psVar7[uVar14].
                 super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
      if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_e0->_M_use_count = local_e0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_e0->_M_use_count = local_e0->_M_use_count + 1;
        }
      }
      local_80 = uVar14;
      if (peVar10 == (element_type *)0x0) {
        local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
      }
      else {
        local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)
                 __dynamic_cast(peVar10,&ChElementBase::typeinfo,&ChElementTetrahedron::typeinfo,
                                0xfffffffffffffffe);
      }
      if (local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = local_e0;
        if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_e0->_M_use_count = local_e0->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_e0->_M_use_count = local_e0->_M_use_count + 1;
          }
        }
      }
      local_b8 = peVar10;
      if (local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0) {
        uVar14 = 0;
        bVar15 = 0;
        do {
          (*(local_d8.
             super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->_vptr_ChElementHexahedron[2])
                    (&local_c8,
                     local_d8.
                     super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,uVar14);
          p_Var1 = local_68._M_buckets[(ulong)local_c8 % local_68._M_bucket_count];
          p_Var9 = (__node_base_ptr)0x0;
          if ((p_Var1 != (__node_base_ptr)0x0) &&
             (p_Var9 = p_Var1, p_Var12 = p_Var1->_M_nxt, p_Var1->_M_nxt[1]._M_nxt != local_c8)) {
            while (p_Var2 = p_Var12->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
              p_Var9 = (__node_base_ptr)0x0;
              if (((ulong)p_Var2[1]._M_nxt % local_68._M_bucket_count !=
                   (ulong)local_c8 % local_68._M_bucket_count) ||
                 (p_Var9 = p_Var12, p_Var12 = p_Var2, p_Var2[1]._M_nxt == local_c8))
              goto LAB_006499d0;
            }
            p_Var9 = (__node_base_ptr)0x0;
          }
LAB_006499d0:
          if (p_Var9 == (__node_base_ptr)0x0) {
            bVar16 = true;
          }
          else {
            bVar16 = p_Var9->_M_nxt == (_Hash_node_base *)0x0;
          }
          if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
          }
          bVar4 = (byte)(1 << ((uint)uVar14 & 0x1f));
          if (bVar16) {
            bVar4 = 0;
          }
          bVar15 = bVar15 | bVar4;
          uVar13 = (uint)uVar14 + 1;
          uVar14 = (ulong)uVar13;
        } while (uVar13 != 4);
        local_c8 = (_Hash_node_base *)((ulong)local_c8 & 0xffffffff00000000);
        iVar5 = 0;
        do {
          if (((&DAT_0099b594)[iVar5] & ~bVar15) == 0) {
            p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x30);
            p_Var8->_M_use_count = 1;
            p_Var8->_M_weak_count = 1;
            p_Var8->_vptr__Sp_counted_base = local_70;
            __gnu_cxx::new_allocator<chrono::fea::ChTetrahedronFace>::
            construct<chrono::fea::ChTetrahedronFace,std::shared_ptr<chrono::fea::ChElementTetrahedron>&,int&>
                      (&local_e1,(ChTetrahedronFace *)(p_Var8 + 1),
                       (shared_ptr<chrono::fea::ChElementTetrahedron> *)&local_d8,(int *)&local_c8);
            local_90 = (ChTetrahedronFace *)(p_Var8 + 1);
            local_88 = p_Var8;
            (*this->_vptr_ChMeshSurface[2])(this,&local_90);
            if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
            }
          }
          iVar3 = (int)local_c8;
          iVar5 = (int)local_c8 + 1;
          local_c8 = (_Hash_node_base *)CONCAT44(local_c8._4_4_,iVar5);
        } while (iVar3 < 3);
      }
      peVar10 = local_b8;
      if (local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d8.
                   super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (peVar10 == (element_type *)0x0) {
        local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
      }
      else {
        local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)
                 __dynamic_cast(peVar10,&ChElementBase::typeinfo,&ChElementHexahedron::typeinfo,
                                0xfffffffffffffffe);
      }
      if ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           *)local_d8.
             super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)0x0) {
        local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = local_e0;
        if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_e0->_M_use_count = local_e0->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_e0->_M_use_count = local_e0->_M_use_count + 1;
          }
        }
      }
      if ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           *)local_d8.
             super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)0x0) {
        uVar13 = 0;
        bVar15 = 0;
        do {
          (*(code *)(local_d8.
                     super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_vptr_ChElementHexahedron[2])
                    (&local_c8,
                     local_d8.
                     super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,uVar13);
          p_Var1 = local_68._M_buckets[(ulong)local_c8 % local_68._M_bucket_count];
          p_Var9 = (__node_base_ptr)0x0;
          if ((p_Var1 != (__node_base_ptr)0x0) &&
             (p_Var9 = p_Var1, p_Var12 = p_Var1->_M_nxt, p_Var1->_M_nxt[1]._M_nxt != local_c8)) {
            while (p_Var2 = p_Var12->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
              p_Var9 = (__node_base_ptr)0x0;
              if (((ulong)p_Var2[1]._M_nxt % local_68._M_bucket_count !=
                   (ulong)local_c8 % local_68._M_bucket_count) ||
                 (p_Var9 = p_Var12, p_Var12 = p_Var2, p_Var2[1]._M_nxt == local_c8))
              goto LAB_00649ba5;
            }
            p_Var9 = (__node_base_ptr)0x0;
          }
LAB_00649ba5:
          if (p_Var9 == (__node_base_ptr)0x0) {
            bVar16 = true;
          }
          else {
            bVar16 = p_Var9->_M_nxt == (_Hash_node_base *)0x0;
          }
          if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
          }
          bVar4 = (byte)(1 << (uVar13 & 0x1f));
          if (bVar16) {
            bVar4 = 0;
          }
          bVar15 = bVar15 | bVar4;
          uVar13 = uVar13 + 1;
        } while (uVar13 != 7);
        local_c8 = (_Hash_node_base *)((ulong)local_c8 & 0xffffffff00000000);
        iVar5 = 0;
        do {
          if (((&DAT_0099b598)[iVar5] & ~bVar15) == 0) {
            p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x30);
            p_Var8->_M_use_count = 1;
            p_Var8->_M_weak_count = 1;
            p_Var8->_vptr__Sp_counted_base = local_78;
            __gnu_cxx::new_allocator<chrono::fea::ChHexahedronFace>::
            construct<chrono::fea::ChHexahedronFace,std::shared_ptr<chrono::fea::ChElementHexahedron>&,int&>
                      ((new_allocator<chrono::fea::ChHexahedronFace> *)&local_e1,
                       (ChHexahedronFace *)(p_Var8 + 1),&local_d8,(int *)&local_c8);
            local_a0 = (ChHexahedronFace *)(p_Var8 + 1);
            local_98 = p_Var8;
            (*this->_vptr_ChMeshSurface[2])(this,&local_a0);
            if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
            }
          }
          iVar3 = (int)local_c8;
          iVar5 = (int)local_c8 + 1;
          local_c8 = (_Hash_node_base *)CONCAT44(local_c8._4_4_,iVar5);
          peVar10 = local_b8;
        } while (iVar3 < 5);
      }
      if (local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d8.
                   super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (peVar10 == (element_type *)0x0) {
        lVar11 = 0;
      }
      else {
        lVar11 = __dynamic_cast(peVar10,&ChElementBase::typeinfo,&ChLoadableUV::typeinfo,
                                0xfffffffffffffffe);
      }
      p_Var8 = local_e0;
      if (lVar11 == 0) {
        p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      if (lVar11 != 0 && local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_e0->_M_use_count = local_e0->_M_use_count + 1;
          UNLOCK();
          p_Var8 = local_e0;
        }
        else {
          local_e0->_M_use_count = local_e0->_M_use_count + 1;
          p_Var8 = local_e0;
        }
      }
      if (lVar11 != 0) {
        if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
          }
        }
        local_b0 = lVar11;
        local_a8 = p_Var8;
        (*this->_vptr_ChMeshSurface[2])(this,&local_b0);
        if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
        }
      }
      if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
      }
      if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
      }
      uVar14 = local_80 + 1;
      psVar7 = (this->mmesh->velements).
               super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar14 < ((ulong)((long)(this->mmesh->velements).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7) >> 4
                      & 0xffffffff));
  }
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void ChMeshSurface::AddFacesFromNodeSet(std::vector<std::shared_ptr<ChNodeFEAbase> >& node_set) {
    std::unordered_set<size_t> node_set_map;
    for (int i = 0; i < node_set.size(); ++i)
        node_set_map.insert((size_t)node_set[i].get());

    for (unsigned int ie = 0; ie < this->mmesh->GetNelements(); ++ie) {
        auto element = mmesh->GetElement(ie);

        if (auto tet = std::dynamic_pointer_cast<ChElementTetrahedron>(element)) {
            unsigned char nodes = 0;  // if the i-th bit is 1, the corressponding hex node is in the set
            for (int in = 0; in < 4; in++) {
                if (node_set_map.find((size_t)tet->GetTetrahedronNode(in).get()) != node_set_map.end())
                    nodes |= 1 << in;
            }
            unsigned char masks[] = {
                0x0E,  // 1110 face 0
                0x0D,  // 1101 face 1
                0x0B,  // 1011 face 2
                0x07   // 0111 face 3
            };
            for (int j = 0; j < 4; j++) {
                if ((nodes & masks[j]) == masks[j])
                    AddFace(chrono_types::make_shared<ChTetrahedronFace>(tet, j));
            }
        }

        if (auto hex = std::dynamic_pointer_cast<ChElementHexahedron>(element)) {
            unsigned char nodes = 0;  // if the i-th bit is 1, the corressponding hex node is in the set
            for (int in = 0; in < 7; in++) {
                if (node_set_map.find((size_t)hex->GetHexahedronNode(in).get()) != node_set_map.end())
                    nodes |= 1 << in;
            }
            unsigned char masks[] = {
                0x0F,  // 00001111 face 0
                0x33,  // 00110011 face 1
                0x66,  // 01100110 face 2
                0xCC,  // 11001100 face 3
                0x99,  // 10011001 face 4
                0xF0   // 11110000 face 5
            };
            for (int j = 0; j < 6; j++) {
                if ((nodes & masks[j]) == masks[j])
                    AddFace(chrono_types::make_shared<ChHexahedronFace>(hex, j));
            }
        }

        if (auto shell = std::dynamic_pointer_cast<ChLoadableUV>(element)) {
            this->AddFace(shell);
        }
    }
}